

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HopcroftKarpAlgorithm.cpp
# Opt level: O0

bool __thiscall BoxNesting::HopcroftKarpAlgorithm::bfs(HopcroftKarpAlgorithm *this)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  reference psVar6;
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  *in_RDI;
  pointer *this_00;
  byte bVar7;
  short j;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  value_type i_1;
  int16_t i;
  queue<short,_std::deque<short,_std::allocator<short>_>_> queue;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  pointer *in_stack_ffffffffffffff30;
  __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_> local_80;
  const_reference local_78;
  short local_6e;
  short local_5a;
  
  std::queue<short,std::deque<short,std::allocator<short>>>::
  queue<std::deque<short,std::allocator<short>>,void>
            ((queue<short,_std::deque<short,_std::allocator<short>_>_> *)in_stack_ffffffffffffff30);
  for (local_5a = 1;
      local_5a <=
      *(short *)&in_RDI[1].
                 super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; local_5a = local_5a + 1) {
    pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)
                        &in_RDI[1].
                         super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(long)local_5a);
    if (*pvVar4 == 0) {
      pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)
                          &in_RDI[3].
                           super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(long)local_5a);
      *pvVar4 = 0;
      std::queue<short,_std::deque<short,_std::allocator<short>_>_>::push
                ((queue<short,_std::deque<short,_std::allocator<short>_>_> *)
                 in_stack_ffffffffffffff30,
                 (value_type *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    }
    else {
      pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)
                          &in_RDI[3].
                           super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(long)local_5a);
      *pvVar4 = 0x7fff;
    }
  }
  pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                     ((vector<short,_std::allocator<short>_> *)
                      &in_RDI[3].
                       super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,0);
  *pvVar4 = 0x7fff;
  while (bVar3 = std::queue<short,_std::deque<short,_std::allocator<short>_>_>::empty
                           ((queue<short,_std::deque<short,_std::allocator<short>_>_> *)0x137503),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    pvVar5 = std::queue<short,_std::deque<short,_std::allocator<short>_>_>::front
                       ((queue<short,_std::deque<short,_std::allocator<short>_>_> *)0x137525);
    local_6e = *pvVar5;
    std::queue<short,_std::deque<short,_std::allocator<short>_>_>::pop
              ((queue<short,_std::deque<short,_std::allocator<short>_>_> *)0x137546);
    pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)
                        &in_RDI[3].
                         super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(long)local_6e);
    sVar1 = *pvVar4;
    pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)
                        &in_RDI[3].
                         super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,0);
    if (sVar1 < *pvVar4) {
      local_78 = std::
                 vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                 ::operator[](in_RDI,(long)local_6e);
      local_80._M_current =
           (short *)std::vector<short,_std::allocator<short>_>::begin
                              ((vector<short,_std::allocator<short>_> *)
                               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      std::vector<short,_std::allocator<short>_>::end
                ((vector<short,_std::allocator<short>_> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>
                                 *)in_stack_ffffffffffffff30,
                                (__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28)),
            bVar3) {
        psVar6 = __gnu_cxx::
                 __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
                 operator*(&local_80);
        sVar1 = *psVar6;
        pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                           ((vector<short,_std::allocator<short>_> *)
                            &in_RDI[2].
                             super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(long)sVar1);
        pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                           ((vector<short,_std::allocator<short>_> *)
                            &in_RDI[3].
                             super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(long)*pvVar4);
        if (*pvVar4 == 0x7fff) {
          in_stack_ffffffffffffff30 =
               &in_RDI[3].
                super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
          pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                             ((vector<short,_std::allocator<short>_> *)in_stack_ffffffffffffff30,
                              (long)local_6e);
          sVar2 = *pvVar4;
          this_00 = &in_RDI[2].
                     super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                             ((vector<short,_std::allocator<short>_> *)this_00,(long)sVar1);
          pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                             ((vector<short,_std::allocator<short>_> *)in_stack_ffffffffffffff30,
                              (long)*pvVar4);
          *pvVar4 = sVar2 + 1;
          std::vector<short,_std::allocator<short>_>::operator[]
                    ((vector<short,_std::allocator<short>_> *)this_00,(long)sVar1);
          std::queue<short,_std::deque<short,_std::allocator<short>_>_>::push
                    ((queue<short,_std::deque<short,_std::allocator<short>_>_> *)
                     in_stack_ffffffffffffff30,
                     (value_type *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        }
        __gnu_cxx::__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
        operator++(&local_80);
      }
    }
  }
  pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                     ((vector<short,_std::allocator<short>_> *)
                      &in_RDI[3].
                       super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,0);
  bVar7 = *pvVar4 != 0x7fff;
  std::queue<short,_std::deque<short,_std::allocator<short>_>_>::~queue
            ((queue<short,_std::deque<short,_std::allocator<short>_>_> *)0x1376d8);
  return (bool)(bVar7 & 1);
}

Assistant:

bool HopcroftKarpAlgorithm::bfs() const
{
	std::queue<int16_t> queue;

	// Iterate through first layer of the graph from the left
	// partition of the bipartite graph. If there is a vertex
	// that doesn't have a pair we add it to the queue
	// since we can use that vertex to traverse.
	// If it allready has a pair we set the distance to
	// to infinite because we can traverse it later from
	// left part of the graph
	for (int16_t i = 1; i <= this->leftVerticesCount; ++i) 
	{ 
		if (this->pairsLeft[i] == NILL) 
		{ 
			this->distances[i] = 0; 
			queue.push(i); 
		} 
		else
		{
			this->distances[i] = INF;
		}
	}

	// If find a shortest augmented path we end at NILL and thus
	// the distance would become the length of the path
	// We use this information to eleminate path that are not the shortest
	// since we can allready see that any path that is longer then this
	// distance is not the shortest path.
	this->distances[NILL] = INF;

	// Continue traversing through the layers
	// While nodes in the partition are unmatched
	// or have a previous match. If that is not the case
	// the next vertex is NILL and we are getting there first
	// time this run
	while (!queue.empty()) 
	{ 
		auto i = queue.front(); 
		queue.pop(); 

		if (this->distances[i] < this->distances[NILL]) 
		{ 
			for (auto j : this->graph[i])
			{
				if (this->distances[this->pairsRight[j]] == INF) 
				{ 
					this->distances[this->pairsRight[j]] = this->distances[i] + 1; 
					queue.push(this->pairsRight[j]); 
				} 
			} 
		} 
	} 

	// If we could come back to NIL using alternating path of distinct 
	// vertices that is shorter then before then distance to null must
	// be set
	return this->distances[NILL] != INF; 
}